

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O3

string * __thiscall
slang::ConstantValue::toString_abi_cxx11_
          (string *__return_storage_ptr__,ConstantValue *this,bitwidth_t abbreviateThresholdBits,
          bool exactUnknowns,bool useAssignmentPatterns)

{
  undefined8 *puVar1;
  long lVar2;
  anon_class_8_3_a073b316 local_10;
  
  lVar2 = (long)(char)*(__index_type *)
                       ((long)&(this->value).
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       + 0x20);
  local_10.abbreviateThresholdBits = abbreviateThresholdBits;
  local_10.exactUnknowns = exactUnknowns;
  local_10.useAssignmentPatterns = useAssignmentPatterns;
  if (lVar2 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/numeric/ConstantValue.cpp:26:9)_&&,_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
      ::_S_vtable._M_arr[lVar2]._M_data)(__return_storage_ptr__,&local_10,&this->value);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_006958a8;
  puVar1[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar1,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

std::string ConstantValue::toString(bitwidth_t abbreviateThresholdBits, bool exactUnknowns,
                                    bool useAssignmentPatterns) const {
    return std::visit(
        [abbreviateThresholdBits, exactUnknowns, useAssignmentPatterns](auto&& arg) {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, std::monostate>)
                return "<unset>"s;
            else if constexpr (std::is_same_v<T, SVInt>)
                return arg.toString(abbreviateThresholdBits, exactUnknowns);
            else if constexpr (std::is_same_v<T, real_t>)
                return fmt::format("{}", double(arg));
            else if constexpr (std::is_same_v<T, shortreal_t>)
                return fmt::format("{}", float(arg));
            else if constexpr (std::is_same_v<T, ConstantValue::NullPlaceholder>)
                return "null"s;
            else if constexpr (std::is_same_v<T, ConstantValue::UnboundedPlaceholder>)
                return "$"s;
            else if constexpr (std::is_same_v<T, Elements>) {
                FormatBuffer buffer;
                buffer.append(useAssignmentPatterns ? "'{"sv : "["sv);
                for (auto& element : arg) {
                    buffer.append(element.toString(abbreviateThresholdBits, exactUnknowns,
                                                   useAssignmentPatterns));
                    buffer.append(",");
                }

                if (!arg.empty())
                    buffer.pop_back();
                buffer.append(useAssignmentPatterns ? "}"sv : "]"sv);
                return buffer.str();
            }
            else if constexpr (std::is_same_v<T, std::string>)
                return fmt::format("\"{}\"", arg);
            else if constexpr (std::is_same_v<T, Map>) {
                FormatBuffer buffer;
                buffer.append(useAssignmentPatterns ? "'{"sv : "["sv);
                for (auto& [key, val] : *arg)
                    buffer.format("{}:{},",
                                  key.toString(abbreviateThresholdBits, exactUnknowns,
                                               useAssignmentPatterns),
                                  val.toString(abbreviateThresholdBits, exactUnknowns,
                                               useAssignmentPatterns));

                if (arg->defaultValue)
                    buffer.format("default:{}",
                                  arg->defaultValue.toString(abbreviateThresholdBits, exactUnknowns,
                                                             useAssignmentPatterns));
                else if (!arg->empty())
                    buffer.pop_back();

                buffer.append(useAssignmentPatterns ? "}"sv : "]"sv);
                return buffer.str();
            }
            else if constexpr (std::is_same_v<T, Queue>) {
                FormatBuffer buffer;
                buffer.append(useAssignmentPatterns ? "'{"sv : "["sv);
                for (auto& element : *arg) {
                    buffer.append(element.toString(abbreviateThresholdBits, exactUnknowns,
                                                   useAssignmentPatterns));
                    buffer.append(",");
                }

                if (!arg->empty())
                    buffer.pop_back();
                buffer.append(useAssignmentPatterns ? "}"sv : "]"sv);
                return buffer.str();
            }
            else if constexpr (std::is_same_v<T, Union>) {
                if (!arg->activeMember)
                    return "(unset)"s;

                return fmt::format("({}) {}", *arg->activeMember,
                                   arg->value.toString(abbreviateThresholdBits, exactUnknowns,
                                                       useAssignmentPatterns));
            }
            else {
                static_assert(always_false<T>::value, "Missing case");
            }
        },
        value);
}